

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QWidget * __thiscall QWidget::grab(QWidget *this,QRect *rectangle)

{
  uint uVar1;
  QWidgetPrivate *this_00;
  long lVar2;
  char cVar3;
  undefined4 uVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 *in_RDX;
  ulong uVar7;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar11;
  undefined1 auVar10 [16];
  QRegion local_60;
  QRect local_58;
  Representation local_48;
  Representation RStack_44;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&rectangle->x2;
  if ((this_00->high_attributes[0] & 0x10000008) != 0x10000000) {
    sendResizeEvents((QWidget *)rectangle);
  }
  uVar1 = *(uint *)&this_00->field_0x250;
  local_58._0_8_ = *in_RDX;
  local_58._8_8_ = in_RDX[1];
  if (((local_58.x2.m_i - local_58.x1.m_i) + 1 < 0) || ((local_58.y2.m_i - local_58.y1.m_i) + 1 < 0)
     ) {
    QRegion::QRegion(&local_60);
    QWidgetPrivate::prepareToRender
              ((QWidgetPrivate *)&stack0xffffffffffffffb8,(QRegion *)this_00,
               (QFlagsStorageHelper<QWidget::RenderFlag,_4>)SUB84(&local_60,0));
    local_58 = (QRect)QRegion::boundingRect();
    QRegion::~QRegion((QRegion *)&stack0xffffffffffffffb8);
    QRegion::~QRegion(&local_60);
    local_58._0_8_ = *in_RDX;
  }
  lVar2 = *(long *)(rectangle + 2);
  local_40._0_4_ = *(int *)(lVar2 + 0x1c) - *(int *)(lVar2 + 0x14);
  local_40._4_4_ = *(int *)(lVar2 + 0x20) - *(int *)(lVar2 + 0x18);
  local_48.m_i = 0;
  RStack_44.m_i = 0;
  cVar3 = QRect::intersects(&local_58);
  if (cVar3 == '\0') {
    QPixmap::QPixmap((QPixmap *)this);
  }
  else {
    uVar4 = QPaintDevice::devicePixelRatio();
    *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&this->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
    dVar9 = extraout_XMM0_Qa * (double)((local_58.x2.m_i - local_58.x1.m_i) + 1);
    dVar11 = extraout_XMM0_Qa * (double)((local_58.y2.m_i - local_58.y1.m_i) + 1);
    auVar10._0_8_ = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
    auVar10._8_8_ = (double)((ulong)dVar11 & 0x8000000000000000 | 0x3fe0000000000000) + dVar11;
    auVar10 = minpd(_DAT_0066f5d0,auVar10);
    auVar8._8_8_ = -(ulong)(-2147483648.0 < auVar10._8_8_);
    auVar8._0_8_ = -(ulong)(-2147483648.0 < auVar10._0_8_);
    uVar5 = movmskpd(uVar4,auVar8);
    uVar7 = 0x8000000000000000;
    if ((uVar5 & 2) != 0) {
      uVar7 = (ulong)(uint)(int)auVar10._8_8_ << 0x20;
    }
    uVar6 = 0x80000000;
    if ((uVar5 & 1) != 0) {
      uVar6 = (ulong)(uint)(int)auVar10._0_8_;
    }
    *(undefined1 **)&this->super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
    _local_48 = (QSize)(uVar6 | uVar7);
    QPixmap::QPixmap((QPixmap *)this,(QSize *)&stack0xffffffffffffffb8);
    QPixmap::setDevicePixelRatio(extraout_XMM0_Qa);
    if ((this_00->field_0x252 & 2) == 0) {
      QColor::QColor((QColor *)&stack0xffffffffffffffb8,transparent);
      QPixmap::fill((QColor *)this);
    }
    local_48.m_i = 0;
    RStack_44.m_i = 0;
    QRegion::QRegion(&local_60,&local_58,Rectangle);
    QWidgetPrivate::render
              (this_00,(QPaintDevice *)this,(QPoint *)&stack0xffffffffffffffb8,&local_60,
               (RenderFlags)0x7);
    QRegion::~QRegion(&local_60);
    *(uint *)&this_00->field_0x250 = *(uint *)&this_00->field_0x250 & 0xfffeffff | uVar1 & 0x10000;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QWidget::grab(const QRect &rectangle)
{
    Q_D(QWidget);
    if (testAttribute(Qt::WA_PendingResizeEvent) || !testAttribute(Qt::WA_WState_Created))
        sendResizeEvents(this);

    const QWidget::RenderFlags renderFlags = QWidget::DrawWindowBackground | QWidget::DrawChildren | QWidget::IgnoreMask;

    const bool oldDirtyOpaqueChildren =  d->dirtyOpaqueChildren;
    QRect r(rectangle);
    if (r.width() < 0 || r.height() < 0) {
        // For grabbing widgets that haven't been shown yet,
        // we trigger the layouting mechanism to determine the widget's size.
        r = d->prepareToRender(QRegion(), renderFlags).boundingRect();
        r.setTopLeft(rectangle.topLeft());
    }

    if (!r.intersects(rect()))
        return QPixmap();

    const qreal dpr = devicePixelRatio();
    QPixmap res((QSizeF(r.size()) * dpr).toSize());
    res.setDevicePixelRatio(dpr);
    if (!d->isOpaque)
        res.fill(Qt::transparent);
    d->render(&res, QPoint(), QRegion(r), renderFlags);

    d->dirtyOpaqueChildren = oldDirtyOpaqueChildren;
    return res;
}